

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_68223b::CCoinsViewTest::BatchWrite
          (CCoinsViewTest *this,CoinsViewCacheCursor *cursor,uint256 *hashBlock)

{
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *this_00;
  long lVar1;
  FastRandomContext *this_01;
  CoinsCachePair *pCVar2;
  CoinsCachePair *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  mapped_type *pmVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint256 *puVar13;
  CoinsCachePair *__k;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>,_std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>_>
  pVar14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __k = (cursor->m_sentinel->second).m_next;
  if (__k != cursor->m_sentinel) {
    this_00 = &this->map_;
    do {
      if (((__k->second).m_flags & 1) != 0) {
        pmVar9 = std::
                 map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                 ::operator[](this_00,&__k->first);
        (pmVar9->out).nValue = (__k->second).coin.out.nValue;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(pmVar9->out).scriptPubKey.super_CScriptBase,
                   &(__k->second).coin.out.scriptPubKey.super_CScriptBase);
        *(undefined4 *)&pmVar9->field_0x28 = *(undefined4 *)&(__k->second).coin.field_0x28;
        if ((__k->second).coin.out.nValue == -1) {
          this_01 = this->m_rng;
          do {
            uVar10 = RandomMixin<FastRandomContext>::randbits
                               (&this_01->super_RandomMixin<FastRandomContext>,2);
          } while (2 < uVar10);
          if (uVar10 == 0) {
            pVar14 = std::
                     _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                     ::equal_range(&this_00->_M_t,&__k->first);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar14.first._M_node,
                           (_Base_ptr)pVar14.second._M_node);
          }
        }
      }
      pCVar2 = (__k->second).m_next;
      if (cursor->m_will_erase == false) {
        if ((__k->second).coin.out.nValue == -1) {
          uVar11 = (ulong)(__k->second).coin.out.scriptPubKey.super_CScriptBase._union.
                          indirect_contents.capacity;
          if ((__k->second).coin.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
            uVar11 = 0;
          }
          uVar12 = 0;
          if ((int)uVar11 != 0) {
            uVar12 = uVar11 + 0x1f & 0xfffffffffffffff0;
          }
          *cursor->m_usage = *cursor->m_usage - uVar12;
          std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&cursor->m_map->_M_h,__k);
        }
        else if ((__k->second).m_flags != '\0') {
          pCVar3 = (__k->second).m_prev;
          (pCVar2->second).m_prev = pCVar3;
          (pCVar3->second).m_next = pCVar2;
          (__k->second).m_flags = '\0';
        }
      }
      __k = pCVar2;
    } while (pCVar2 != cursor->m_sentinel);
  }
  puVar13 = (uint256 *)
            std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (hashBlock,hashBlock + 1);
  if (puVar13 != hashBlock + 1) {
    uVar4 = *(undefined4 *)(hashBlock->super_base_blob<256U>).m_data._M_elems;
    uVar5 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 4);
    uVar6 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 8);
    uVar7 = *(undefined4 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0xc);
    uVar8 = *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((hashBlock->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
    *(undefined4 *)(this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems = uVar4;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 4) = uVar5;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
    *(undefined4 *)((this->hashBestBlock_).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool BatchWrite(CoinsViewCacheCursor& cursor, const uint256& hashBlock) override
    {
        for (auto it{cursor.Begin()}; it != cursor.End(); it = cursor.NextAndMaybeErase(*it)){
            if (it->second.IsDirty()) {
                // Same optimization used in CCoinsViewDB is to only write dirty entries.
                map_[it->first] = it->second.coin;
                if (it->second.coin.IsSpent() && m_rng.randrange(3) == 0) {
                    // Randomly delete empty entries on write.
                    map_.erase(it->first);
                }
            }
        }
        if (!hashBlock.IsNull())
            hashBestBlock_ = hashBlock;
        return true;
    }